

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::Encode(GridAxisIrregular *this,KDataStream *stream)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  
  GridAxisRegular::Encode(&this->super_GridAxisRegular,stream);
  KDataStream::Write<double>(stream,(double)this->m_f64CoordScaleXi);
  KDataStream::Write<double>(stream,(double)this->m_f64CoordOffsetXi);
  puVar1 = (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_vXiValues).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    KDataStream::Write<unsigned_short>(stream,*puVar2);
  }
  puVar1 = (this->m_vui16Padding).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_vui16Padding).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    KDataStream::Write<unsigned_short>(stream,*puVar2);
  }
  return;
}

Assistant:

void GridAxisIrregular::Encode( KDataStream & stream ) const
{
    GridAxisRegular::Encode( stream );

    stream << m_f64CoordScaleXi
           << m_f64CoordOffsetXi;

    vector<KUINT16>::const_iterator citr = m_vXiValues.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vXiValues.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    // Padding
    citr = m_vui16Padding.begin();
    citrEnd = m_vui16Padding.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}